

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2Replace(void)

{
  ostringstream *poVar1;
  char *pattern;
  char *__s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ReplaceTest *pRVar5;
  char *pcVar6;
  string all;
  string one;
  string local_208;
  char *local_1e8;
  StringPiece local_1e0;
  string local_1d0;
  LogMessage local_1b0;
  
  pRVar5 = RE2Replace::tests;
  pcVar6 = "the quick brown fox jumps over the lazy dogs.";
  do {
    std::__cxx11::string::string((string *)&local_1d0,pcVar6,(allocator *)&local_1b0);
    pattern = pRVar5->regexp;
    RE2::RE2((RE2 *)&local_1b0,pattern);
    __s = pRVar5->rewrite;
    local_208._M_dataplus._M_p = __s;
    local_1e8 = pattern;
    if (__s == (char *)0x0) {
      local_208._M_string_length._0_4_ = 0;
    }
    else {
      sVar4 = strlen(__s);
      local_208._M_string_length._0_4_ = (undefined4)sVar4;
    }
    bVar2 = RE2::Replace(&local_1d0,(RE2 *)&local_1b0,(StringPiece *)&local_208);
    RE2::~RE2((RE2 *)&local_1b0);
    if (!bVar2) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb4,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,
                 "Check failed: RE2::Replace(&one, t->regexp, t->rewrite)",0x37);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar3 != 0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb5,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: (one) == (t->single)",0x22);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    std::__cxx11::string::string((string *)&local_208,pcVar6,(allocator *)&local_1b0);
    RE2::RE2((RE2 *)&local_1b0,local_1e8);
    local_1e0.ptr_ = __s;
    if (__s == (char *)0x0) {
      local_1e0.length_ = 0;
    }
    else {
      sVar4 = strlen(__s);
      local_1e0.length_ = (int)sVar4;
    }
    poVar1 = &local_1b0.str_;
    iVar3 = RE2::GlobalReplace(&local_208,(RE2 *)&local_1b0,&local_1e0);
    RE2::~RE2((RE2 *)&local_1b0);
    if (iVar3 != pRVar5->greplace_count) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb7,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Check failed: (RE2::GlobalReplace(&all, t->regexp, t->rewrite)) == (t->greplace_count)"
                 ,0x56);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got: ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_208._M_dataplus._M_p,
                 CONCAT44(local_208._M_string_length._4_4_,(undefined4)local_208._M_string_length));
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar3 != 0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb9,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: (all) == (t->global)",0x22);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    pcVar6 = pRVar5[1].original;
    pRVar5 = pRVar5 + 1;
  } while (pcVar6 != (char *)0x0);
  return;
}

Assistant:

TEST(RE2, Replace) {
  VLOG(1) << "TestReplace";

  struct ReplaceTest {
    const char *regexp;
    const char *rewrite;
    const char *original;
    const char *single;
    const char *global;
    int        greplace_count;
  };
  static const ReplaceTest tests[] = {
    { "(qu|[b-df-hj-np-tv-z]*)([a-z]+)",
      "\\2\\1ay",
      "the quick brown fox jumps over the lazy dogs.",
      "ethay quick brown fox jumps over the lazy dogs.",
      "ethay ickquay ownbray oxfay umpsjay overay ethay azylay ogsday.",
      9 },
    { "\\w+",
      "\\0-NOSPAM",
      "abcd.efghi@google.com",
      "abcd-NOSPAM.efghi@google.com",
      "abcd-NOSPAM.efghi-NOSPAM@google-NOSPAM.com-NOSPAM",
      4 },
    { "^",
      "(START)",
      "foo",
      "(START)foo",
      "(START)foo",
      1 },
    { "^",
      "(START)",
      "",
      "(START)",
      "(START)",
      1 },
    { "$",
      "(END)",
      "",
      "(END)",
      "(END)",
      1 },
    { "b",
      "bb",
      "ababababab",
      "abbabababab",
      "abbabbabbabbabb",
      5 },
    { "b",
      "bb",
      "bbbbbb",
      "bbbbbbb",
      "bbbbbbbbbbbb",
      6 },
    { "b+",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "aaaaa",
      "bbaaaaa",
      "bbabbabbabbabbabb",
      6 },
    // Check newline handling
    { "a.*a",
      "(\\0)",
      "aba\naba",
      "(aba)\naba",
      "(aba)\n(aba)",
      2 },
    { "", NULL, NULL, NULL, NULL, 0 }
  };

  for (const ReplaceTest* t = tests; t->original != NULL; t++) {
    VLOG(1) << StringPrintf("\"%s\" =~ s/%s/%s/g", t->original, t->regexp, t->rewrite);
    string one(t->original);
    CHECK(RE2::Replace(&one, t->regexp, t->rewrite));
    CHECK_EQ(one, t->single);
    string all(t->original);
    CHECK_EQ(RE2::GlobalReplace(&all, t->regexp, t->rewrite), t->greplace_count)
      << "Got: " << all;
    CHECK_EQ(all, t->global);
  }
}